

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O1

void __thiscall
duckdb::RowVersionManager::CommitAppend
          (RowVersionManager *this,transaction_t commit_id,idx_t row_group_start,idx_t count)

{
  ulong uVar1;
  int iVar2;
  reference this_00;
  type pCVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (count == 0) {
    return;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    uVar4 = row_group_start >> 0xb;
    uVar1 = (count + row_group_start) - 1;
    uVar6 = uVar1 >> 0xb;
    lVar7 = uVar6 - uVar4;
    if (uVar4 <= uVar6) {
      lVar8 = 0;
      do {
        uVar6 = 0;
        if (lVar8 == 0) {
          uVar6 = (ulong)((uint)row_group_start & 0x7ff);
        }
        lVar5 = 0x800;
        if (lVar7 == lVar8) {
          lVar5 = (count + row_group_start) - (uVar1 & 0xfffffffffffff800);
        }
        this_00 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                  ::operator[](&this->vector_info,uVar4 + lVar8);
        pCVar3 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                 operator*(this_00);
        (*pCVar3->_vptr_ChunkInfo[5])(pCVar3,commit_id,uVar6,lVar5);
        lVar8 = lVar8 + 1;
      } while (lVar7 + 1 != lVar8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void RowVersionManager::CommitAppend(transaction_t commit_id, idx_t row_group_start, idx_t count) {
	if (count == 0) {
		return;
	}
	idx_t row_group_end = row_group_start + count;

	lock_guard<mutex> lock(version_lock);
	idx_t start_vector_idx = row_group_start / STANDARD_VECTOR_SIZE;
	idx_t end_vector_idx = (row_group_end - 1) / STANDARD_VECTOR_SIZE;
	for (idx_t vector_idx = start_vector_idx; vector_idx <= end_vector_idx; vector_idx++) {
		idx_t vstart = vector_idx == start_vector_idx ? row_group_start - start_vector_idx * STANDARD_VECTOR_SIZE : 0;
		idx_t vend =
		    vector_idx == end_vector_idx ? row_group_end - end_vector_idx * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		auto &info = *vector_info[vector_idx];
		info.CommitAppend(commit_id, vstart, vend);
	}
}